

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool google::protobuf::anon_unknown_1::RetrieveOptionsAssumingRightPool
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FieldDescriptor *arg;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  int iVar9;
  string tmp;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string fieldval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string local_130;
  int local_10c;
  void *local_108;
  void *pvStack_100;
  long local_f8;
  Message *local_e8;
  int local_e0;
  int local_dc;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_98;
  long *local_90;
  long local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  
  local_98 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(option_entries,
                    (option_entries->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x16])(options);
  local_90 = (long *)CONCAT44(extraout_var,iVar5);
  local_108 = (void *)0x0;
  pvStack_100 = (void *)0x0;
  local_f8 = 0;
  local_e8 = options;
  (**(code **)(*local_90 + 0x80))(local_90,options);
  if (pvStack_100 != local_108) {
    paVar1 = &local_130.field_2;
    local_e0 = depth + 1;
    local_88 = (long)(depth * 2);
    uVar8 = 0;
    do {
      local_10c = *(int *)(*(long *)((long)local_108 + uVar8 * 8) + 0x4c);
      iVar5 = 1;
      if (local_10c == 3) {
        iVar5 = (**(code **)(*local_90 + 0x30))(local_90,local_e8);
      }
      if (0 < iVar5) {
        iVar9 = 0;
        local_dc = iVar5;
        do {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          local_d8._M_string_length = 0;
          local_d8.field_2._M_local_buf[0] = '\0';
          arg = *(FieldDescriptor **)((long)local_108 + uVar8 * 8);
          if (*(GoogleOnceDynamic **)(arg + 0x40) != (GoogleOnceDynamic *)0x0) {
            GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                      (*(GoogleOnceDynamic **)(arg + 0x40),FieldDescriptor::TypeOnceInit,arg);
          }
          if ((*(uint *)(arg + 0x48) & 0xfffffffe) == 10) {
            local_130._M_string_length = 0;
            local_130.field_2._M_allocated_capacity =
                 local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_130._M_dataplus._M_p = (pointer)paVar1;
            TextFormat::Printer::Printer((Printer *)&local_80);
            local_80 = (undefined1 *)CONCAT44(local_80._4_4_,local_e0);
            iVar5 = -1;
            if (local_10c == 3) {
              iVar5 = iVar9;
            }
            TextFormat::Printer::PrintFieldValueToString
                      ((Printer *)&local_80,local_e8,
                       *(FieldDescriptor **)((long)local_108 + uVar8 * 8),iVar5,&local_130);
            std::__cxx11::string::append((char *)&local_d8);
            std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_130._M_dataplus._M_p);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_d8,local_d8._M_string_length,0,(char)local_88);
            std::__cxx11::string::append((char *)&local_d8);
            TextFormat::Printer::~Printer((Printer *)&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar1) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            iVar5 = -1;
            if (local_10c == 3) {
              iVar5 = iVar9;
            }
            TextFormat::PrintFieldValueToString
                      (local_e8,*(FieldDescriptor **)((long)local_108 + uVar8 * 8),iVar5,&local_d8);
          }
          local_80 = &local_70;
          local_78 = 0;
          local_70 = 0;
          paVar2 = &local_b8.field_2;
          if (*(char *)(*(long *)((long)local_108 + uVar8 * 8) + 0x50) == '\x01') {
            std::operator+(&local_b8,"(.",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (*(long *)((long)local_108 + uVar8 * 8) + 8));
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
            puVar7 = (ulong *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar7) {
              local_130.field_2._M_allocated_capacity = *puVar7;
              local_130.field_2._8_8_ = plVar6[3];
              local_130._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_130.field_2._M_allocated_capacity = *puVar7;
              local_130._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_130._M_string_length = plVar6[1];
            *plVar6 = (long)puVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_80,(string *)&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != paVar1) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != paVar2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::_M_assign((string *)&local_80);
          }
          local_b8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_80,local_80 + local_78);
          std::__cxx11::string::append((char *)&local_b8);
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b8,(ulong)local_d8._M_dataplus._M_p);
          puVar7 = (ulong *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar7) {
            local_130.field_2._M_allocated_capacity = *puVar7;
            local_130.field_2._8_8_ = plVar6[3];
            local_130._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_130.field_2._M_allocated_capacity = *puVar7;
            local_130._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_130._M_string_length = plVar6[1];
          *plVar6 = (long)puVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_98,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar1) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                     local_d8.field_2._M_local_buf[0]) + 1);
          }
          iVar9 = iVar9 + 1;
        } while (local_dc != iVar9);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)pvStack_100 - (long)local_108 >> 3));
  }
  pbVar3 = *(pointer *)local_98;
  pbVar4 = *(pointer *)(local_98 + 8);
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,local_f8 - (long)local_108);
  }
  return pbVar3 != pbVar4;
}

Assistant:

bool RetrieveOptionsAssumingRightPool(int depth, const Message& options,
                                      std::vector<string>* option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i],
                                        repeated ? j : -1, &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}